

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ConcurrentAssertionStatementSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((1 < kind - CoverPropertyStatement) && (kind != AssertPropertyStatement)) &&
      (kind != AssumePropertyStatement)) &&
     ((kind != ExpectPropertyStatement && (kind != RestrictPropertyStatement)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConcurrentAssertionStatementSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AssertPropertyStatement:
        case SyntaxKind::AssumePropertyStatement:
        case SyntaxKind::CoverPropertyStatement:
        case SyntaxKind::CoverSequenceStatement:
        case SyntaxKind::ExpectPropertyStatement:
        case SyntaxKind::RestrictPropertyStatement:
            return true;
        default:
            return false;
    }
}